

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

float __thiscall comparer_context::cmp<float>(comparer_context *this,string *name)

{
  ostream *poVar1;
  float e;
  float a;
  stringstream ss;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [16];
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  read<float>(this,&local_1dc,&local_1e0);
  if (ABS(local_1dc - local_1e0) <= 0.1) {
    return local_1dc;
  }
  local_1d8 = ZEXT416((uint)ABS(local_1dc - local_1e0));
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Expected ",9);
  poVar1 = std::ostream::_M_insert<double>((double)local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but actual is ",0x10);
  poVar1 = std::ostream::_M_insert<double>((double)local_1dc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (delta is ",0xb);
  poVar1 = std::ostream::_M_insert<double>((double)(float)local_1d8._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  failure(this,&local_1c8,name);
}

Assistant:

float comparer_context :: cmp<float>(const std::string& name)
{
    float a,e,t;
    read(a,e);

    if((t=fabs(a-e)) > MY_FLT_EPSILON) {
        std::stringstream ss;
        failure((ss<< "Expected " << e << ", but actual is "
            << a << " (delta is " << t << ")", ss.str()),name);
    }
    return a;
}